

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabItem(void)

{
  ImGuiTabItem *this;
  ImGuiTabItem *tab;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  ImVector<ImGuiTabItem> *in_stack_ffffffffffffffe0;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    if (GImGui->CurrentTabBar == (ImGuiTabBar *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1bc2,"EndTabItem","ImGui ASSERT FAILED: %s",
                  "tab_bar != NULL && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                 );
    }
    else {
      if (GImGui->CurrentTabBar->LastTabItemIdx < 0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1bc5,"EndTabItem","ImGui ASSERT FAILED: %s","tab_bar->LastTabItemIdx >= 0");
      }
      this = ImVector<ImGuiTabItem>::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc)
      ;
      if ((this->Flags & 8U) == 0) {
        ImVector<unsigned_int>::pop_back((ImVector<unsigned_int> *)this);
      }
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar != NULL && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        window->IDStack.pop_back();
}